

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnElemSegmentElemExpr_RefNull
          (BinaryReaderInterp *this,Index segment_index)

{
  Result RVar1;
  ElemExpr local_10;
  
  RVar1 = SharedValidator::OnElemSegmentElemExpr_RefNull
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc);
  if (RVar1.enum_ != Error) {
    local_10.kind = RefNull;
    local_10.index = 0;
    std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>::
    emplace_back<wabt::interp::ElemExpr>
              (&(this->module_->elems).
                super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].elements,&local_10);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnElemSegmentElemExpr_RefNull(Index segment_index) {
  CHECK_RESULT(validator_.OnElemSegmentElemExpr_RefNull(loc));
  ElemDesc& elem = module_.elems.back();
  elem.elements.push_back(ElemExpr{ElemKind::RefNull, 0});
  return Result::Ok;
}